

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O0

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  int iVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  char *pcVar4;
  Value *pVVar5;
  TValue *o1;
  TValue *o2;
  char *name;
  CallInfo *ci;
  int n_local;
  lua_Debug *ar_local;
  lua_State *L_local;
  
  pCVar2 = L->base_ci;
  iVar1 = ar->i_ci;
  pcVar4 = findlocal(L,pCVar2 + iVar1,n);
  if (pcVar4 != (char *)0x0) {
    pTVar3 = L->top;
    pVVar5 = &pCVar2[iVar1].base[n + -1].value;
    *pVVar5 = pTVar3[-1].value;
    pVVar5[1].b = pTVar3[-1].tt;
  }
  L->top = L->top + -1;
  return pcVar4;
}

Assistant:

LUA_API const char *lua_setlocal (lua_State *L, const lua_Debug *ar, int n) {
  CallInfo *ci = L->base_ci + ar->i_ci;
  const char *name = findlocal(L, ci, n);
  lua_lock(L);
  if (name)
      setobjs2s(L, ci->base + (n - 1), L->top - 1);
  L->top--;  /* pop value */
  lua_unlock(L);
  return name;
}